

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O2

void collectDependencies(string *filename,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *lines)

{
  bool bVar1;
  pointer pbVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  pointer pbVar6;
  string output;
  anon_class_8_1_898e5cf2 local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_lines;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&output,"otool -l \"",filename);
  std::operator+(&cmd,&output,"\"");
  std::__cxx11::string::~string((string *)&output);
  system_get_output(&output,&cmd);
  lVar4 = std::__cxx11::string::find((char *)&output,0x118390);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)&output,0x1183a0);
    if ((lVar4 == -1) && (output._M_string_length != 0)) {
      raw_lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      raw_lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      raw_lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tokenize(&output,"\n",&raw_lines);
      pbVar2 = raw_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar1 = false;
      pbVar6 = raw_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pbVar6 == pbVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&raw_lines);
          std::__cxx11::string::~string((string *)&output);
          std::__cxx11::string::~string((string *)&cmd);
          return;
        }
        local_b0.line = pbVar6;
        bVar3 = collectDependencies::anon_class_8_1_898e5cf2::operator()
                          (&local_b0,"cmd LC_LOAD_DYLIB");
        if (bVar3) {
LAB_00107bb1:
          bVar3 = true;
          if (bVar1) {
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "\n\n/!\\ ERROR: Failed to find name before next cmd");
            std::endl<char,std::char_traits<char>>(poVar5);
            goto LAB_00107c76;
          }
        }
        else {
          bVar3 = collectDependencies::anon_class_8_1_898e5cf2::operator()
                            (&local_b0,"cmd LC_REEXPORT_DYLIB");
          if (bVar3) goto LAB_00107bb1;
          bVar3 = bVar1;
          if (bVar1) {
            lVar4 = std::__cxx11::string::find((char *)pbVar6,0x118432);
            if (lVar4 != -1) {
              std::__cxx11::string::substr((ulong)&local_70,(ulong)pbVar6);
              std::operator+(&local_50,'\t',&local_70);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                         &local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              bVar3 = false;
            }
          }
        }
        bVar1 = bVar3;
        pbVar6 = pbVar6 + 1;
      } while( true );
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot find file ");
  poVar5 = std::operator<<(poVar5,(string *)filename);
  poVar5 = std::operator<<(poVar5," to read its dependencies");
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_00107c76:
  exit(1);
}

Assistant:

void collectDependencies(const std::string& filename, std::vector<std::string>& lines)
{
    // execute "otool -l" on the given file and collect the command's output
    std::string cmd = "otool -l \"" + filename + "\"";
    std::string output = system_get_output(cmd);

    if(output.find("can't open file")!=std::string::npos or output.find("No such file")!=std::string::npos or output.size()<1)
    {
        std::cerr << "Cannot find file " << filename << " to read its dependencies" << std::endl;
        exit(1);
    }
    
    // split output
    std::vector<std::string> raw_lines;
    tokenize(output, "\n", &raw_lines);

    bool searching = false;
    for(const auto& line : raw_lines) {
        const auto &is_prefix = [&line](const char *const p) { return line.find(p) != std::string::npos; };
        if (is_prefix("cmd LC_LOAD_DYLIB") || is_prefix("cmd LC_REEXPORT_DYLIB"))
        {
            if (searching)
            {
                std::cerr << "\n\n/!\\ ERROR: Failed to find name before next cmd" << std::endl;
                exit(1);
            }
            searching = true;
        }
        else if (searching)
        {
            size_t found = line.find("name ");
            if (found != std::string::npos)
            {
                lines.push_back('\t' + line.substr(found+5, std::string::npos));
                searching = false;
            }
        }
    }
}